

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int32 vector_is_nan(float32 *vec,int32 len)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = 0;
  }
  uVar2 = 0;
  do {
    if (uVar3 == uVar2) {
      return 0;
    }
    pfVar1 = (float *)(vec + uVar2);
    uVar2 = uVar2 + 1;
  } while (!NAN(*pfVar1));
  return 1;
}

Assistant:

int32
vector_is_nan(float32 * vec, int32 len)
{
    int32 i;
    int result;
    for (i = 0; i < len; i++) {
#if defined(WIN32)
        result = _isnan(vec[i]);
#else
        result = isnan(vec[i]);
#endif
	if (result)
	    return 1;
    }
    return 0;
}